

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moduleexecutors.cpp
# Opt level: O3

bool __thiscall
trun::TestModuleExecutorSequential::Execute
          (TestModuleExecutorSequential *this,Ref *library,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
          *testModules)

{
  pointer pcVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer psVar5;
  pointer psVar6;
  bool bVar7;
  kRunResultAction kVar8;
  bool bVar9;
  int iVar10;
  ILogger *pIVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  Config *pCVar14;
  _Atomic_word _Var15;
  pointer pbVar16;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  _Var17;
  _Rb_tree_header *p_Var18;
  pointer psVar19;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __first;
  long lVar20;
  __normal_iterator<std::shared_ptr<trun::TestModule>_*,_std::vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>_>
  __i;
  long lVar21;
  shared_ptr<trun::TestModule> *psVar22;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  testModulesList;
  Ref result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argModuleName;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  matches;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  local_98;
  undefined8 local_78;
  TestModuleExecutorSequential *local_70;
  Ref local_68;
  Ref local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  pointer local_38;
  
  local_d8._0_8_ = &local_c8;
  local_70 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"TestModExeSeq","");
  pIVar11 = gnilk::Logger::GetLogger((string *)local_d8);
  *(ILogger **)&local_70->field_0x8 = pIVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ != &local_c8) {
    operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
  }
  local_f8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (shared_ptr<trun::TestModule> *)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (shared_ptr<trun::TestModule> *)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var12 = (testModules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var18 = &(testModules->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var18) {
    do {
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::push_back(&local_f8,(value_type *)(p_Var12 + 2));
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      psVar19 = local_f8.
                super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = local_f8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while ((_Rb_tree_header *)p_Var12 != p_Var18);
    if (local_f8.
        super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar21 = (long)local_f8.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = lVar21 >> 4;
      lVar20 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                (local_f8.
                 super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_f8.
                 super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar21 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                  (psVar5,psVar19);
      }
      else {
        psVar22 = psVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Iter_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                  (psVar5,psVar22);
        for (; psVar22 != psVar19; psVar22 = psVar22 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<trun::TestModule>*,std::vector<std::shared_ptr<trun::TestModule>,std::allocator<std::shared_ptr<trun::TestModule>>>>,__gnu_cxx::__ops::_Val_comp_iter<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__0>>
                    (psVar22);
        }
      }
    }
  }
  pCVar14 = Config::Instance();
  pbVar16 = (pCVar14->modules).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_40._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (pCVar14->modules).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar16 != (pointer)local_40._M_pi) {
    local_78 = library;
    do {
      local_b8._0_8_ = local_b8 + 0x10;
      pcVar1 = (pbVar16->_M_dataplus)._M_p;
      local_38 = pbVar16;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,pcVar1,pcVar1 + pbVar16->_M_string_length);
      psVar5 = local_f8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_f8.
          super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_f8.
          super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar9 = false;
        psVar19 = local_f8.
                  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,"-");
          if (iVar10 == 0) {
            std::
            vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
            ::push_back(&local_98,psVar19);
          }
          else if (*(char *)(_Hash_node_base **)local_b8._0_8_ == '!') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_b8,1,0xffffffffffffffff);
            bVar7 = match(&((psVar19->
                            super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->name,(string *)local_d8);
            if (bVar7) {
              bVar9 = true;
              std::
              vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
              ::push_back(&local_98,psVar19);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._0_8_ != &local_c8) {
              operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
            }
            if (bVar7) break;
          }
          else {
            bVar7 = match(&((psVar19->
                            super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_b8);
            if (bVar7) {
              std::
              vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
              ::push_back(&local_98,psVar19);
              psVar19 = local_98.
                        super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar5 = local_98.
                       super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              goto LAB_0010cf0f;
            }
          }
          psVar19 = psVar19 + 1;
        } while (psVar19 != psVar5);
        psVar6 = local_f8.
                 super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar19 = local_98.
                  super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = local_98.
                 super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (bVar9) {
          if ((long)local_98.
                    super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
            __assert_fail("matches.size() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/moduleexecutors.cpp"
                          ,0x86,
                          "virtual bool trun::TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &, const std::map<std::string, TestModule::Ref> &)"
                         );
          }
          peVar2 = ((local_98.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_00 = ((local_98.
                      super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                    _M_pi;
          if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uVar13 = (long)local_f8.
                           super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_f8.
                           super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_0010d035;
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              uVar13 = (long)local_f8.
                             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (__libc_single_threaded != '\0') goto LAB_0010d048;
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') {
                _Var15 = this_00->_M_use_count;
                goto LAB_0010d050;
              }
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') {
                _Var15 = this_00->_M_use_count;
                goto LAB_0010d055;
              }
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
                goto LAB_0010d061;
              }
              _Var15 = this_00->_M_use_count;
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_0010d035:
              this_00->_M_use_count = this_00->_M_use_count + 1;
              uVar13 = (long)local_f8.
                             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_f8.
                             super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
LAB_0010d048:
              _Var15 = this_00->_M_use_count + 1;
              this_00->_M_use_count = _Var15;
LAB_0010d050:
              _Var15 = _Var15 + 1;
              this_00->_M_use_count = _Var15;
LAB_0010d055:
              _Var15 = _Var15 + 1;
            }
            this_00->_M_use_count = _Var15 + 1;
          }
LAB_0010d061:
          _Var17._M_current =
               local_f8.
               super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (long)uVar13 >> 6) {
            local_48 = (element_type *)
                       ((long)&((local_f8.
                                 super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + (uVar13 & 0xffffffffffffffc0));
            lVar20 = ((long)uVar13 >> 6) + 1;
            do {
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                      ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                    *)peVar2,_Var17);
              __first._M_current = _Var17._M_current;
              if (bVar9) goto LAB_0010d173;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                      ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                    *)peVar2,_Var17._M_current + 1);
              __first._M_current = _Var17._M_current + 1;
              if (bVar9) goto LAB_0010d173;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                      ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                    *)peVar2,_Var17._M_current + 2);
              __first._M_current = _Var17._M_current + 2;
              if (bVar9) goto LAB_0010d173;
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                      ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                    *)peVar2,_Var17._M_current + 3);
              __first._M_current = _Var17._M_current + 3;
              if (bVar9) goto LAB_0010d173;
              _Var17._M_current = _Var17._M_current + 4;
              lVar20 = lVar20 + -1;
            } while (1 < lVar20);
            uVar13 = (long)psVar6 - (long)local_48;
            _Var17._M_current = (shared_ptr<trun::TestModule> *)local_48;
          }
          lVar20 = (long)uVar13 >> 4;
          if (lVar20 == 1) {
LAB_0010d150:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                    ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                  *)peVar2,_Var17);
            __first._M_current = _Var17._M_current;
            if (!bVar9) {
              __first._M_current = psVar6;
            }
          }
          else if (lVar20 == 2) {
LAB_0010d137:
            bVar9 = __gnu_cxx::__ops::
                    _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                    ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                  *)peVar2,_Var17);
            __first._M_current = _Var17._M_current;
            if (!bVar9) {
              _Var17._M_current = _Var17._M_current + 1;
              goto LAB_0010d150;
            }
          }
          else {
            __first._M_current = psVar6;
            if ((lVar20 == 3) &&
               (bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                        ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                      *)peVar2,_Var17), __first._M_current = _Var17._M_current,
               !bVar9)) {
              _Var17._M_current = _Var17._M_current + 1;
              goto LAB_0010d137;
            }
          }
LAB_0010d173:
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          _Var17._M_current = __first._M_current;
          if (__first._M_current != psVar6) {
            while (psVar22 = _Var17._M_current, _Var17._M_current = psVar22 + 1,
                  _Var17._M_current != psVar6) {
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::$_1>
                      ::operator()((_Iter_pred<trun::TestModuleExecutorSequential::Execute(std::shared_ptr<trun::IDynLibrary>const&,std::map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>const&)::__1>
                                    *)peVar2,_Var17);
              if (!bVar9) {
                peVar3 = ((_Var17._M_current)->
                         super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                p_Var4 = psVar22[1].super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                ((_Var17._M_current)->
                super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                     (element_type *)0x0;
                psVar22[1].super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                this_01 = ((__first._M_current)->
                          super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi;
                ((__first._M_current)->
                super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
                ((__first._M_current)->
                super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
                     = p_Var4;
                if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                }
                __first._M_current = __first._M_current + 1;
              }
            }
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          std::
          vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
          ::_M_erase(&local_f8,(iterator)__first._M_current,
                     (iterator)
                     local_f8.
                     super__Vector_base<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        else {
LAB_0010cf0f:
          for (; psVar19 != psVar5; psVar19 = psVar19 + 1) {
            while (peVar2 = (psVar19->
                            super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  , peVar2->state == Idle) {
              (**(code **)(**(long **)&local_70->field_0x8 + 0x30))
                        (*(long **)&local_70->field_0x8,"Executing tests for library: %s",
                         (peVar2->name)._M_dataplus._M_p);
              local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (psVar19->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (psVar19->super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
              if (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              TestRunner::SetCurrentTestModule(&local_68);
              if (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              TestModule::Execute((TestModule *)local_d8,
                                  (Ref *)(psVar19->
                                         super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
LAB_0010cfba:
                local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                TestRunner::SetCurrentTestModule(&local_58);
                if (local_58.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_58.
                             super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                bVar9 = false;
              }
              else {
                kVar8 = TestResult::CheckIfContinue((TestResult *)local_d8._0_8_);
                bVar9 = true;
                if (kVar8 != kAbortAll) goto LAB_0010cfba;
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
              }
              psVar19 = psVar19 + 1;
              if (bVar9 || psVar19 == psVar5) goto LAB_0010d210;
            }
          }
        }
      }
LAB_0010d210:
      std::
      vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>
      ::~vector(&local_98);
      if ((_Hash_node_base *)local_b8._0_8_ != (_Hash_node_base *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,local_a8._M_allocated_capacity + 1);
      }
      pbVar16 = local_38 + 1;
    } while (pbVar16 != (pointer)local_40._M_pi);
  }
  std::
  vector<std::shared_ptr<trun::TestModule>,_std::allocator<std::shared_ptr<trun::TestModule>_>_>::
  ~vector(&local_f8);
  return true;
}

Assistant:

bool TestModuleExecutorSequential::Execute(const IDynLibrary::Ref &library, const std::map<std::string, TestModule::Ref> &testModules) {
    bool bRes = true;
    pLogger = gnilk::Logger::GetLogger("TestModExeSeq");

    // Convert to vector and sort..
    std::vector<TestModule::Ref> testModulesList;
    for(auto &[k,v] : testModules) {
        testModulesList.push_back(v);
    }
    std::sort(testModulesList.begin(), testModulesList.end(), [](const TestModule::Ref &a, const TestModule::Ref &b) {
        return (a->name < b->name);
    });


    // For every argument on the command line
    for(auto argModuleName : Config::Instance().modules) {
        // Match cases
        std::vector<TestModule::Ref> matches;
        auto matchResult = ModuleMatch(matches, argModuleName, testModulesList);
        // In case this is negative (i.e. don't execute) we remove it from the sorted LOCAL list
        // NOTE: DO NOT change the state - if can be that another module depends on this one - in that case we need to execute...
        if (matchResult == kMatchResult::NegativeSingle) {
            assert(matches.size() == 1);
            auto tmToRemove = matches[0];
            // Remove this from the execution list...
            std::erase_if(testModulesList,[tmToRemove](const TestModule::Ref &m)->bool{
               return (tmToRemove->name == m->name);
            });
            continue;
        }

        // If here, we should execute anything in the matches list...
        for(auto &testModule : matches) {
            // Already executed?
            if (!testModule->IsIdle()) {
                //pLogger->Debug("Tests for '%s' already executed, skipping",testModule->name.c_str());
                continue;
            }

            pLogger->Info("Executing tests for library: %s", testModule->name.c_str());

            TestRunner::SetCurrentTestModule(testModule);
            auto result = testModule->Execute(library);
            if ((result != nullptr) && (result->CheckIfContinue() == TestResult::kRunResultAction::kAbortAll)) {
                break;
            }
            TestRunner::SetCurrentTestModule(nullptr);
        } // for modules

    }

    return bRes;
}